

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

void __thiscall
QPDF::reconstruct_xref::anon_class_16_2_2ef5c38d::operator()(anon_class_16_2_2ef5c38d *this)

{
  QPDFExc *__return_storage_ptr__;
  ulong in_RSI;
  string local_68;
  string local_48;
  
  if ((ulong)((long)this->this[0x4f].m._M_t.
                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                    super__Head_base<0UL,_QPDF::Members_*,_false> -
              (long)this->this[0x4e].m._M_t.
                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                    super__Head_base<0UL,_QPDF::Members_*,_false> >> 7) <= in_RSI) {
    return;
  }
  __return_storage_ptr__ = (QPDFExc *)__cxa_allocate_exception(0x80);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"too many errors while reconstructing cross-reference table","");
  damagedPDF(__return_storage_ptr__,(QPDF *)this,&local_68,-1,&local_48);
  __cxa_throw(__return_storage_ptr__,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::setTrailer(QPDFObjectHandle obj)
{
    if (m->trailer) {
        return;
    }
    m->trailer = obj;
}